

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

MessageOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::MessageOptions>
          (Tables *this,MessageOptions *param_1)

{
  pointer *pppMVar1;
  iterator __position;
  MessageOptions *this_00;
  MessageOptions *local_18;
  
  this_00 = (MessageOptions *)operator_new(0x70);
  MessageOptions::MessageOptions(this_00);
  __position._M_current =
       (this->messages_).
       super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->messages_).
      super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18 = this_00;
    std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
    _M_realloc_insert<google::protobuf::Message*>
              ((vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>> *)
               &this->messages_,__position,(Message **)&local_18);
  }
  else {
    *__position._M_current = (Message *)this_00;
    pppMVar1 = &(this->messages_).
                super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppMVar1 = *pppMVar1 + 1;
  }
  return this_00;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.push_back(result);
  return result;
}